

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

char_type * __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::as_cstring
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  short_string_storage *this_00;
  string *s;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffa0;
  json_runtime_error<std::domain_error,_void> *this_01;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffffe8;
  char_type *local_8;
  
  jVar1 = storage_kind(in_RDI);
  switch(jVar1) {
  case short_str:
    this_00 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
              cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::short_string_storage>
                        (in_stack_ffffffffffffffa0);
    local_8 = short_string_storage::c_str(this_00);
    break;
  case json_const_reference:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffa0);
    json_const_reference_storage::value((json_const_reference_storage *)0x27acf9);
    local_8 = as_cstring(in_stack_ffffffffffffffe8);
    break;
  case json_reference:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffa0);
    json_reference_storage::value((json_reference_storage *)0x27ad1d);
    local_8 = as_cstring(in_stack_ffffffffffffffe8);
    break;
  default:
    s = (string *)__cxa_allocate_exception(0x18);
    this_01 = (json_runtime_error<std::domain_error,_void> *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    json_runtime_error<std::domain_error,_void>::json_runtime_error(this_01,s);
    __cxa_throw(s,&json_runtime_error<std::domain_error,void>::typeinfo,
                json_runtime_error<std::domain_error,_void>::~json_runtime_error);
  case long_str:
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::long_string_storage>
              (in_stack_ffffffffffffffa0);
    local_8 = long_string_storage::c_str((long_string_storage *)0x27acdd);
  }
  return local_8;
}

Assistant:

const char_type* as_cstring() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                    return cast<short_string_storage>().c_str();
                case json_storage_kind::long_str:
                    return cast<long_string_storage>().c_str();
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_cstring();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_cstring();
                default:
                    JSONCONS_THROW(json_runtime_error<std::domain_error>("Not a cstring"));
            }
        }